

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void AddDrawListToDrawData(ImVector<ImDrawList_*> *out_list,ImDrawList *draw_list)

{
  int *piVar1;
  uint uVar2;
  ImDrawList **ppIVar3;
  int iVar4;
  ImDrawList **__dest;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  ImDrawList::_PopUnusedDrawCmd(draw_list);
  if ((draw_list->CmdBuffer).Size != 0) {
    uVar2 = (draw_list->VtxBuffer).Size;
    if (((long)(int)uVar2 != 0) &&
       (draw_list->_VtxWritePtr != (draw_list->VtxBuffer).Data + (int)uVar2)) {
      __assert_fail("draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x102c,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    lVar7 = (long)(draw_list->IdxBuffer).Size;
    if ((lVar7 != 0) && (draw_list->_IdxWritePtr != (draw_list->IdxBuffer).Data + lVar7)) {
      __assert_fail("draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x102d,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    uVar5 = draw_list->_VtxCurrentIdx;
    if (((draw_list->Flags & 8) == 0) && (uVar5 = uVar2, draw_list->_VtxCurrentIdx != uVar2)) {
      __assert_fail("(int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x102f,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    if (0xffff < uVar5) {
      __assert_fail("draw_list->_VtxCurrentIdx < (1 << 16) && \"Too many vertices in ImDrawList using 16-bit indices. Read comment above\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x1041,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    iVar4 = out_list->Size;
    if (iVar4 == out_list->Capacity) {
      if (iVar4 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar4 / 2 + iVar4;
      }
      iVar8 = iVar4 + 1;
      if (iVar4 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImDrawList **)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
      if (out_list->Data != (ImDrawList **)0x0) {
        memcpy(__dest,out_list->Data,(long)out_list->Size << 3);
        ppIVar3 = out_list->Data;
        if ((ppIVar3 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      out_list->Data = __dest;
      out_list->Capacity = iVar8;
      iVar4 = out_list->Size;
    }
    else {
      __dest = out_list->Data;
    }
    __dest[iVar4] = draw_list;
    out_list->Size = out_list->Size + 1;
  }
  return;
}

Assistant:

static void AddDrawListToDrawData(ImVector<ImDrawList*>* out_list, ImDrawList* draw_list)
{
    // Remove trailing command if unused.
    // Technically we could return directly instead of popping, but this make things looks neat in Metrics/Debugger window as well.
    draw_list->_PopUnusedDrawCmd();
    if (draw_list->CmdBuffer.Size == 0)
        return;

    // Draw list sanity check. Detect mismatch between PrimReserve() calls and incrementing _VtxCurrentIdx, _VtxWritePtr etc.
    // May trigger for you if you are using PrimXXX functions incorrectly.
    IM_ASSERT(draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size);
    IM_ASSERT(draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size);
    if (!(draw_list->Flags & ImDrawListFlags_AllowVtxOffset))
        IM_ASSERT((int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size);

    // Check that draw_list doesn't use more vertices than indexable (default ImDrawIdx = unsigned short = 2 bytes = 64K vertices per ImDrawList = per window)
    // If this assert triggers because you are drawing lots of stuff manually:
    // - First, make sure you are coarse clipping yourself and not trying to draw many things outside visible bounds.
    //   Be mindful that the ImDrawList API doesn't filter vertices. Use the Metrics/Debugger window to inspect draw list contents.
    // - If you want large meshes with more than 64K vertices, you can either:
    //   (A) Handle the ImDrawCmd::VtxOffset value in your renderer backend, and set 'io.BackendFlags |= ImGuiBackendFlags_RendererHasVtxOffset'.
    //       Most example backends already support this from 1.71. Pre-1.71 backends won't.
    //       Some graphics API such as GL ES 1/2 don't have a way to offset the starting vertex so it is not supported for them.
    //   (B) Or handle 32-bit indices in your renderer backend, and uncomment '#define ImDrawIdx unsigned int' line in imconfig.h.
    //       Most example backends already support this. For example, the OpenGL example code detect index size at compile-time:
    //         glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer_offset);
    //       Your own engine or render API may use different parameters or function calls to specify index sizes.
    //       2 and 4 bytes indices are generally supported by most graphics API.
    // - If for some reason neither of those solutions works for you, a workaround is to call BeginChild()/EndChild() before reaching
    //   the 64K limit to split your draw commands in multiple draw lists.
    if (sizeof(ImDrawIdx) == 2)
        IM_ASSERT(draw_list->_VtxCurrentIdx < (1 << 16) && "Too many vertices in ImDrawList using 16-bit indices. Read comment above");

    out_list->push_back(draw_list);
}